

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O3

void project_monster_handler_MON_DRAIN(project_monster_handler_context_t *context)

{
  _Bool _Var1;
  
  if (context->seen == true) {
    context->obvious = true;
    flag_on_dbg(context->lore->flags,0xc,0x49,"context->lore->flags","RF_UNDEAD");
  }
  _Var1 = monster_is_nonliving(context->mon);
  if (_Var1) {
    context->hurt_msg = MON_MSG_UNAFFECTED;
    context->obvious = false;
    context->dam = L'\0';
  }
  return;
}

Assistant:

static void project_monster_handler_MON_DRAIN(project_monster_handler_context_t *context)
{
	if (context->seen) context->obvious = true;
	if (context->seen) {
		rf_on(context->lore->flags, RF_UNDEAD);
	}
	if (monster_is_nonliving(context->mon)) {
		context->hurt_msg = MON_MSG_UNAFFECTED;
		context->obvious = false;
		context->dam = 0;
	}
}